

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::RE2Bug1816809(void)

{
  bool bVar1;
  string x;
  Arg *args [1];
  StringPiece piece;
  RE2 re;
  undefined1 *local_2a8;
  undefined8 local_2a0;
  undefined1 local_298 [16];
  Arg *local_288;
  StringPiece local_280;
  RE2 local_270;
  undefined1 local_190 [384];
  
  RE2::RE2(&local_270,"(((((llx((-3)|(4)))(;(llx((-3)|(4))))*))))");
  local_280.ptr_ = "llx-3;llx4";
  local_280.length_ = 10;
  local_2a0 = 0;
  local_298[0] = 0;
  local_288 = (Arg *)local_190;
  local_190._8_8_ = RE2::Arg::parse_string;
  local_2a8 = local_298;
  local_190._0_8_ = &local_2a8;
  bVar1 = RE2::ConsumeN(&local_280,&local_270,&local_288,1);
  if (!bVar1) {
    LogMessage::LogMessage
              ((LogMessage *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5c1,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_190 + 8),"Check failed: RE2::Consume(&piece, re, &x)",0x2a);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_190);
  }
  if (local_2a8 != local_298) {
    operator_delete(local_2a8);
  }
  RE2::~RE2(&local_270);
  return;
}

Assistant:

TEST(RE2, Bug1816809) {
  RE2 re("(((((llx((-3)|(4)))(;(llx((-3)|(4))))*))))");
  StringPiece piece("llx-3;llx4");
  string x;
  EXPECT_TRUE(RE2::Consume(&piece, re, &x));
}